

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_art_index.cpp
# Opt level: O2

SinkFinalizeType __thiscall
duckdb::PhysicalCreateARTIndex::Finalize
          (PhysicalCreateARTIndex *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true> *this_00;
  SchemaCatalogEntry *this_01;
  pointer puVar1;
  CatalogTransaction transaction;
  ClientContext *pCVar2;
  __type _Var3;
  int iVar4;
  pointer pBVar5;
  undefined4 extraout_var;
  pointer pCVar6;
  shared_ptr<duckdb::DataTableInfo,_true> *this_02;
  DataTableInfo *pDVar7;
  type pIVar8;
  undefined4 extraout_var_00;
  Catalog *this_03;
  AlterInfo *info;
  optional_ptr<duckdb::CatalogEntry,_true> oVar9;
  type pCVar10;
  undefined4 extraout_var_01;
  idx_t iVar11;
  CatalogException *pCVar12;
  TransactionException *this_04;
  GlobalSinkState *this_05;
  pointer this_06;
  allocator local_101;
  pthread_mutex_t *local_100;
  ClientContext *local_f8;
  DataTable *local_f0;
  _Head_base<0UL,_duckdb::BoundIndex_*,_false> local_e8;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  CatalogTransaction local_80;
  CatalogTransaction local_58;
  
  this_05 = input->global_state + 1;
  local_f8 = context;
  pBVar5 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                       *)this_05);
  BoundIndex::Vacuum(pBVar5);
  pBVar5 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::operator->
                     ((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                       *)this_05);
  BoundIndex::VerifyAllocations(pBVar5);
  iVar4 = (*(this->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])();
  local_f0 = (DataTable *)CONCAT44(extraout_var,iVar4);
  if ((local_f0->version)._M_i != MAIN_TABLE) {
    this_04 = (TransactionException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_e0,
               "Transaction conflict: cannot add an index to a table that has been altered or dropped"
               ,(allocator *)&local_c0);
    TransactionException::TransactionException(this_04,&local_e0);
    __cxa_throw(this_04,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this_01 = (this->table->super_TableCatalogEntry).super_StandardEntry.schema;
  this_00 = &this->info;
  pCVar6 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>::
           operator->(this_00);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&pCVar6->column_ids,
             &(this->storage_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  pCVar2 = local_f8;
  if ((this->alter_table_info).
      super_unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::AlterTableInfo_*,_std::default_delete<duckdb::AlterTableInfo>_>
      .super__Head_base<0UL,_duckdb::AlterTableInfo_*,_false>._M_head_impl == (AlterTableInfo *)0x0)
  {
    SchemaCatalogEntry::GetCatalogTransaction(&local_58,this_01,local_f8);
    pCVar6 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
             ::operator->(this_00);
    transaction.context.ptr._0_4_ = (int)local_58.context.ptr;
    transaction.db.ptr = local_58.db.ptr;
    transaction.context.ptr._4_4_ = (int)((ulong)local_58.context.ptr >> 0x20);
    transaction.transaction.ptr._0_4_ = (int)local_58.transaction.ptr;
    transaction.transaction.ptr._4_4_ = (int)((ulong)local_58.transaction.ptr >> 0x20);
    transaction.transaction_id._0_4_ = (int)local_58.transaction_id;
    transaction.transaction_id._4_4_ = (int)(local_58.transaction_id >> 0x20);
    transaction.start_time = local_58.start_time;
    oVar9 = SchemaCatalogEntry::GetEntry(this_01,transaction,INDEX_ENTRY,&pCVar6->index_name);
    if (oVar9.ptr != (CatalogEntry *)0x0) {
      pCVar6 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->(this_00);
      if ((pCVar6->super_CreateInfo).on_conflict == IGNORE_ON_CONFLICT) {
        return READY;
      }
      pCVar12 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_e0,"Index with name \"%s\" already exists!",(allocator *)&local_c0
                );
      pCVar6 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->(this_00);
      ::std::__cxx11::string::string((string *)&local_a0,(string *)&pCVar6->index_name);
      CatalogException::CatalogException<std::__cxx11::string>(pCVar12,&local_e0,&local_a0);
      __cxa_throw(pCVar12,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    SchemaCatalogEntry::GetCatalogTransaction(&local_80,this_01,pCVar2);
    pCVar10 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
              ::operator*(this_00);
    iVar4 = (*(this_01->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x12])
                      (this_01,pCVar10,this->table);
    pBVar5 = unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>::
             operator->((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>,_true>
                         *)this_05);
    iVar11 = BoundIndex::GetInMemorySize(pBVar5);
    *(idx_t *)(CONCAT44(extraout_var_01,iVar4) + 0x1f8) = iVar11;
  }
  else {
    this_02 = DataTable::GetDataTableInfo(local_f0);
    pDVar7 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(this_02);
    local_100 = (pthread_mutex_t *)&pDVar7->indexes;
    ::std::mutex::lock((mutex *)&local_100->__data);
    puVar1 = (pDVar7->indexes).indexes.
             super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_06 = (pDVar7->indexes).indexes.
                   super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_06 != puVar1;
        this_06 = this_06 + 1) {
      pIVar8 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator*
                         (this_06);
      iVar4 = (*pIVar8->_vptr_Index[4])(pIVar8);
      pCVar6 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
               ::operator->(this_00);
      _Var3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(extraout_var_00,iVar4),&pCVar6->index_name);
      if (_Var3) {
        pCVar12 = (CatalogException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_e0,"an index with that name already exists for this table: %s",
                   &local_101);
        pCVar6 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
                 ::operator->(this_00);
        ::std::__cxx11::string::string((string *)&local_c0,(string *)&pCVar6->index_name);
        CatalogException::CatalogException<std::__cxx11::string>(pCVar12,&local_e0,&local_c0);
        __cxa_throw(pCVar12,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    pthread_mutex_unlock(local_100);
    pCVar6 = unique_ptr<duckdb::CreateIndexInfo,_std::default_delete<duckdb::CreateIndexInfo>,_true>
             ::operator->(this_00);
    pCVar2 = local_f8;
    this_03 = Catalog::GetCatalog(local_f8,&(pCVar6->super_CreateInfo).catalog);
    info = &unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true>::
            operator*(&this->alter_table_info)->super_AlterInfo;
    Catalog::Alter(this_03,pCVar2,info);
  }
  local_e8._M_head_impl =
       (((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_> *)
        &this_05->_vptr_GlobalSinkState)->_M_t).
       super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
       super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl;
  (((unique_ptr<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_> *)
   &this_05->_vptr_GlobalSinkState)->_M_t).
  super___uniq_ptr_impl<duckdb::BoundIndex,_std::default_delete<duckdb::BoundIndex>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundIndex_*,_std::default_delete<duckdb::BoundIndex>_>.
  super__Head_base<0UL,_duckdb::BoundIndex_*,_false>._M_head_impl = (BoundIndex *)0x0;
  DataTable::AddIndex(local_f0,(unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>
                                *)&local_e8);
  if (local_e8._M_head_impl != (BoundIndex *)0x0) {
    (*((local_e8._M_head_impl)->super_Index)._vptr_Index[1])();
  }
  return READY;
}

Assistant:

SinkFinalizeType PhysicalCreateARTIndex::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                  OperatorSinkFinalizeInput &input) const {
	auto &state = input.global_state.Cast<CreateARTIndexGlobalSinkState>();

	// Vacuum excess memory and verify.
	state.global_index->Vacuum();
	D_ASSERT(!state.global_index->VerifyAndToString(true).empty());
	state.global_index->VerifyAllocations();

	auto &storage = table.GetStorage();
	if (!storage.IsMainTable()) {
		throw TransactionException(
		    "Transaction conflict: cannot add an index to a table that has been altered or dropped");
	}

	auto &schema = table.schema;
	info->column_ids = storage_ids;

	if (!alter_table_info) {
		// Ensure that the index does not yet exist in the catalog.
		auto entry = schema.GetEntry(schema.GetCatalogTransaction(context), CatalogType::INDEX_ENTRY, info->index_name);
		if (entry) {
			if (info->on_conflict != OnCreateConflict::IGNORE_ON_CONFLICT) {
				throw CatalogException("Index with name \"%s\" already exists!", info->index_name);
			}
			// IF NOT EXISTS on existing index. We are done.
			return SinkFinalizeType::READY;
		}

		auto index_entry = schema.CreateIndex(schema.GetCatalogTransaction(context), *info, table).get();
		D_ASSERT(index_entry);
		auto &index = index_entry->Cast<DuckIndexEntry>();
		index.initial_index_size = state.global_index->GetInMemorySize();

	} else {
		// Ensure that there are no other indexes with that name on this table.
		auto &indexes = storage.GetDataTableInfo()->GetIndexes();
		indexes.Scan([&](Index &index) {
			if (index.GetIndexName() == info->index_name) {
				throw CatalogException("an index with that name already exists for this table: %s", info->index_name);
			}
			return false;
		});

		auto &catalog = Catalog::GetCatalog(context, info->catalog);
		catalog.Alter(context, *alter_table_info);
	}

	// Add the index to the storage.
	storage.AddIndex(std::move(state.global_index));
	return SinkFinalizeType::READY;
}